

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_xop.cpp
# Opt level: O3

void ncnn::im2col_sgemm_int8_sse_xop(Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  int iVar4;
  void *pvVar5;
  void *pvVar6;
  size_t sVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ulong uVar11;
  uint uVar12;
  long lVar13;
  undefined1 *puVar14;
  ulong uVar15;
  uint _h;
  ulong *puVar16;
  long lVar17;
  int *piVar18;
  undefined4 *puVar19;
  int iVar20;
  void *pvVar21;
  long lVar22;
  size_t sVar23;
  undefined1 *puVar24;
  undefined4 *puVar25;
  long lVar26;
  ulong uVar27;
  undefined4 *puVar28;
  int iVar29;
  long lVar30;
  void *pvVar31;
  int iVar32;
  long lVar33;
  int iVar34;
  long lVar35;
  uint uVar36;
  ulong uVar37;
  undefined1 (*pauVar38) [16];
  undefined1 (*pauVar39) [16];
  ulong *puVar40;
  undefined4 *puVar41;
  ulong *puVar42;
  void *pvVar43;
  undefined1 auVar44 [16];
  undefined1 auVar46 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 local_88 [64];
  size_t local_48;
  ulong local_38;
  undefined1 auVar45 [64];
  undefined1 auVar47 [64];
  
  uVar3 = bottom_im2col->w;
  iVar34 = bottom_im2col->h;
  uVar36 = bottom_im2col->c;
  lVar35 = (long)(int)uVar36;
  iVar4 = top_blob->c;
  local_48 = 0;
  local_88._0_8_ = (void *)0x0;
  local_88._8_4_ = 0;
  local_88._12_4_ = 0;
  local_88._16_8_ = 0;
  local_88._24_4_ = 0;
  local_88._32_8_ = (Allocator *)0x0;
  local_88._40_4_ = 0;
  local_88._44_4_ = 0;
  local_88._48_12_ = SUB1612((undefined1  [16])0x0,4);
  iVar20 = iVar34;
  uVar12 = uVar3;
  if (lVar35 < 4) {
    iVar32 = 1;
    sVar23 = 1;
    _h = uVar36;
    if (1 < (int)uVar3) {
      iVar20 = iVar34 * 2;
      uVar12 = (uVar3 & 1) + (uVar3 >> 1);
      iVar32 = 1;
    }
  }
  else if ((int)uVar3 < 2) {
    iVar32 = 4;
    sVar23 = 4;
    _h = (uVar36 & 3) + (uVar36 >> 2);
  }
  else {
    sVar23 = 4;
    iVar20 = iVar34 * 2;
    _h = (uVar36 & 3) + (uVar36 >> 2);
    uVar12 = (uVar3 & 1) + (uVar3 >> 1);
    iVar32 = 4;
  }
  Mat::create((Mat *)local_88,iVar20,_h,uVar12,sVar23,iVar32,opt->workspace_allocator);
  uVar11 = (ulong)(int)uVar3;
  if (0 < (int)uVar3 >> 1) {
    lVar17 = 1;
    uVar37 = 0;
    do {
      puVar24 = (undefined1 *)(local_48 * uVar37 * local_88._16_8_ + local_88._0_8_);
      if ((int)uVar36 < 4) {
        uVar27 = 0;
      }
      else {
        lVar26 = 3;
        lVar30 = 1;
        lVar33 = 2;
        uVar15 = 0;
        do {
          if (0 < iVar34) {
            lVar13 = bottom_im2col->elemsize * bottom_im2col->cstep;
            lVar22 = (long)bottom_im2col->data + lVar17;
            iVar20 = iVar34;
            do {
              *puVar24 = *(undefined1 *)(lVar22 + -1 + lVar13 * uVar15);
              puVar24[1] = *(undefined1 *)(lVar22 + -1 + lVar13 * lVar30);
              puVar24[2] = *(undefined1 *)(lVar22 + -1 + lVar13 * lVar33);
              puVar24[3] = *(undefined1 *)(lVar22 + -1 + lVar13 * lVar26);
              puVar24[4] = *(undefined1 *)(lVar22 + lVar13 * uVar15);
              puVar24[5] = *(undefined1 *)(lVar22 + lVar13 * lVar30);
              puVar24[6] = *(undefined1 *)(lVar22 + lVar13 * lVar33);
              puVar24[7] = *(undefined1 *)(lVar22 + lVar13 * lVar26);
              puVar24 = puVar24 + 8;
              lVar22 = lVar22 + (ulong)uVar3;
              iVar20 = iVar20 + -1;
            } while (iVar20 != 0);
          }
          uVar27 = uVar15 + 4;
          lVar13 = uVar15 + 7;
          lVar26 = lVar26 + 4;
          lVar30 = lVar30 + 4;
          lVar33 = lVar33 + 4;
          uVar15 = uVar27;
        } while (lVar13 < lVar35);
      }
      if ((int)uVar27 < (int)uVar36) {
        uVar27 = uVar27 & 0xffffffff;
        do {
          if (0 < iVar34) {
            lVar26 = bottom_im2col->cstep * bottom_im2col->elemsize * uVar27;
            lVar30 = (long)bottom_im2col->data + lVar17;
            iVar20 = iVar34;
            do {
              *puVar24 = *(undefined1 *)(lVar30 + -1 + lVar26);
              puVar24[1] = *(undefined1 *)(lVar30 + lVar26);
              puVar24 = puVar24 + 2;
              lVar30 = lVar30 + (ulong)uVar3;
              iVar20 = iVar20 + -1;
            } while (iVar20 != 0);
          }
          uVar27 = uVar27 + 1;
        } while (uVar27 != uVar36);
      }
      uVar37 = uVar37 + 1;
      lVar17 = lVar17 + 2;
    } while (uVar37 != (uint)((int)uVar3 >> 1));
  }
  uVar37 = uVar11 & 0xfffffffffffffffe;
  if ((uint)uVar37 != uVar3) {
    do {
      uVar12 = ((uint)(uVar37 >> 0x1f) & 1) + (int)uVar37;
      puVar24 = (undefined1 *)
                (local_88._16_8_ * local_48 *
                 (long)(int)(((int)uVar12 >> 1) + ((int)uVar37 - (uVar12 & 0xfffffffe))) +
                local_88._0_8_);
      if ((int)uVar36 < 4) {
        uVar27 = 0;
      }
      else {
        lVar17 = 1;
        lVar26 = 2;
        lVar30 = 3;
        uVar15 = 0;
        do {
          if (0 < iVar34) {
            lVar33 = bottom_im2col->elemsize * bottom_im2col->cstep;
            lVar13 = (long)bottom_im2col->data + uVar37;
            iVar20 = iVar34;
            do {
              *puVar24 = *(undefined1 *)(lVar13 + lVar33 * uVar15);
              puVar24[1] = *(undefined1 *)(lVar13 + lVar33 * lVar17);
              puVar24[2] = *(undefined1 *)(lVar13 + lVar33 * lVar26);
              puVar24[3] = *(undefined1 *)(lVar13 + lVar33 * lVar30);
              puVar24 = puVar24 + 4;
              lVar13 = lVar13 + uVar11;
              iVar20 = iVar20 + -1;
            } while (iVar20 != 0);
          }
          uVar27 = uVar15 + 4;
          lVar33 = uVar15 + 7;
          lVar17 = lVar17 + 4;
          lVar26 = lVar26 + 4;
          lVar30 = lVar30 + 4;
          uVar15 = uVar27;
        } while (lVar33 < lVar35);
      }
      if ((int)uVar27 < (int)uVar36) {
        uVar27 = uVar27 & 0xffffffff;
        do {
          if (0 < iVar34) {
            puVar14 = (undefined1 *)
                      ((long)bottom_im2col->data +
                      uVar37 + bottom_im2col->cstep * uVar27 * bottom_im2col->elemsize);
            iVar20 = iVar34;
            do {
              *puVar24 = *puVar14;
              puVar24 = puVar24 + 1;
              puVar14 = puVar14 + uVar11;
              iVar20 = iVar20 + -1;
            } while (iVar20 != 0);
          }
          uVar27 = uVar27 + 1;
        } while (uVar27 != uVar36);
      }
      uVar37 = uVar37 + 1;
    } while ((long)uVar37 < (long)uVar11);
  }
  if (0 < iVar4 >> 2) {
    pvVar5 = top_blob->data;
    lVar35 = top_blob->elemsize * top_blob->cstep;
    pvVar6 = kernel->data;
    lVar17 = kernel->elemsize * kernel->cstep;
    uVar12 = uVar36 + 3;
    if (-1 < (int)uVar36) {
      uVar12 = uVar36;
    }
    iVar20 = ((int)uVar12 >> 2) * iVar34;
    iVar32 = ((int)uVar36 % 4) * iVar34;
    local_38 = (ulong)(uint)(iVar4 >> 2);
    uVar37 = 0;
    do {
      puVar19 = (undefined4 *)(uVar37 * 4 * lVar35 + (long)pvVar5);
      puVar25 = (undefined4 *)((uVar37 * 4 + 1) * lVar35 + (long)pvVar5);
      puVar41 = (undefined4 *)((uVar37 * 4 + 2) * lVar35 + (long)pvVar5);
      puVar28 = (undefined4 *)((uVar37 * 4 + 3) * lVar35 + (long)pvVar5);
      if ((int)uVar3 < 2) {
        uVar27 = 0;
      }
      else {
        pauVar38 = (undefined1 (*) [16])(uVar37 * lVar17 + (long)pvVar6);
        uVar15 = 0;
        do {
          puVar16 = (ulong *)((uVar15 >> 1) * local_88._16_8_ * local_48 + local_88._0_8_);
          auVar45 = ZEXT1664((undefined1  [16])0x0);
          auVar44 = (undefined1  [16])0x0;
          if (0 < iVar20) {
            auVar44._8_8_ = 0;
            auVar44._0_8_ = *puVar16;
            auVar8 = vpmovsxbw_avx(auVar44);
            auVar44 = *pauVar38;
            auVar46 = vpcmpgtb_avx((undefined1  [16])0x0,auVar44);
            vpunpcklbw_avx(auVar44,auVar46);
            vpunpckhbw_avx(auVar44,auVar46);
            vpshufd_avx(auVar8,0x44);
            halt_baddata();
          }
          auVar47 = ZEXT1664((undefined1  [16])0x0);
          auVar46 = (undefined1  [16])0x0;
          if (0 < iVar32) {
            lVar26 = 0;
            do {
              auVar44 = vpmovsxbw_avx(ZEXT216(*(ushort *)((long)puVar16 + lVar26 * 2)));
              auVar44 = vpshuflw_avx(auVar44,0x50);
              auVar9 = vpshufd_avx(auVar44,0x50);
              auVar46._8_8_ = 0;
              auVar46._0_8_ = *(ulong *)(*pauVar38 + lVar26 * 4);
              auVar44 = vpmovsxbw_avx(auVar46);
              auVar44 = vpshufd_avx(auVar44,0x44);
              auVar8 = vpmullw_avx(auVar9,auVar44);
              auVar44 = vpmulhw_avx(auVar9,auVar44);
              auVar46 = vpunpcklwd_avx(auVar8,auVar44);
              auVar46 = vpaddd_avx(auVar47._0_16_,auVar46);
              auVar47 = ZEXT1664(auVar46);
              auVar44 = vpunpckhwd_avx(auVar8,auVar44);
              auVar44 = vpaddd_avx(auVar45._0_16_,auVar44);
              auVar45 = ZEXT1664(auVar44);
              lVar26 = lVar26 + 1;
            } while (iVar32 != (int)lVar26);
          }
          *puVar19 = auVar46._0_4_;
          *puVar25 = auVar46._4_4_;
          *puVar41 = auVar46._8_4_;
          *puVar28 = auVar46._12_4_;
          puVar19[1] = auVar44._0_4_;
          puVar25[1] = auVar44._4_4_;
          puVar41[1] = auVar44._8_4_;
          puVar28[1] = auVar44._12_4_;
          puVar19 = puVar19 + 2;
          puVar25 = puVar25 + 2;
          puVar41 = puVar41 + 2;
          puVar28 = puVar28 + 2;
          uVar27 = uVar15 + 2;
          lVar26 = uVar15 + 3;
          uVar15 = uVar27;
        } while (lVar26 < (long)uVar11);
      }
      if ((int)uVar27 < (int)uVar3) {
        pauVar38 = (undefined1 (*) [16])(uVar37 * lVar17 + (long)pvVar6);
        do {
          puVar16 = (ulong *)((ulong)(((uint)uVar27 & 1) + ((uint)(uVar27 >> 1) & 0x7fffffff)) *
                              local_88._16_8_ * local_48 + local_88._0_8_);
          auVar45 = ZEXT1664((undefined1  [16])0x0);
          pauVar39 = pauVar38;
          if (0 < iVar20) {
            auVar47 = ZEXT1664((undefined1  [16])0x0);
            auVar49 = ZEXT1664((undefined1  [16])0x0);
            auVar50 = ZEXT1664((undefined1  [16])0x0);
            iVar29 = iVar20;
            do {
              auVar8._8_8_ = 0;
              auVar8._0_8_ = *puVar16;
              auVar8 = vpmovsxbw_avx(auVar8);
              auVar44 = *pauVar39;
              auVar46 = vpcmpgtb_avx((undefined1  [16])0x0,auVar44);
              auVar10 = vpunpcklbw_avx(auVar44,auVar46);
              auVar9 = vpunpckhbw_avx(auVar44,auVar46);
              auVar44 = vpshufd_avx(auVar8,0x44);
              auVar8 = vpmullw_avx(auVar10,auVar44);
              auVar46 = vpmulhw_avx(auVar10,auVar44);
              auVar10 = vpmullw_avx(auVar44,auVar9);
              auVar9 = vpmulhw_avx(auVar44,auVar9);
              auVar44 = vpunpcklwd_avx(auVar8,auVar46);
              auVar44 = vpaddd_avx(auVar50._0_16_,auVar44);
              auVar50 = ZEXT1664(auVar44);
              auVar46 = vpunpckhwd_avx(auVar8,auVar46);
              auVar46 = vpaddd_avx(auVar49._0_16_,auVar46);
              auVar49 = ZEXT1664(auVar46);
              auVar8 = vpunpcklwd_avx(auVar10,auVar9);
              auVar8 = vpaddd_avx(auVar47._0_16_,auVar8);
              auVar47 = ZEXT1664(auVar8);
              auVar9 = vpunpckhwd_avx(auVar10,auVar9);
              auVar9 = vpaddd_avx(auVar45._0_16_,auVar9);
              auVar45 = ZEXT1664(auVar9);
              puVar16 = (ulong *)((long)puVar16 + 4);
              pauVar39 = pauVar39 + 1;
              iVar29 = iVar29 + -1;
            } while (iVar29 != 0);
            auVar10 = vpunpckldq_avx(auVar44,auVar46);
            auVar48 = vpunpckldq_avx(auVar8,auVar9);
            auVar46 = vpunpckhdq_avx(auVar44,auVar46);
            auVar8 = vpunpckhdq_avx(auVar8,auVar9);
            auVar9 = vpunpcklqdq_avx(auVar10,auVar48);
            auVar44 = vpunpckhqdq_avx(auVar10,auVar48);
            auVar44 = vpaddd_avx(auVar9,auVar44);
            auVar9 = vpunpcklqdq_avx(auVar46,auVar8);
            auVar46 = vpunpckhqdq_avx(auVar46,auVar8);
            auVar46 = vpaddd_avx(auVar46,auVar9);
            auVar44 = vpaddd_avx(auVar44,auVar46);
            auVar45 = ZEXT1664(auVar44);
          }
          auVar44 = auVar45._0_16_;
          if (0 < iVar32) {
            lVar26 = 0;
            do {
              auVar44 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)puVar16 + lVar26)),0);
              auVar8 = vpshufd_avx(auVar44,0);
              auVar9._8_8_ = 0;
              auVar9._0_8_ = *(ulong *)(*pauVar39 + lVar26 * 4);
              auVar44 = vpmovsxbw_avx(auVar9);
              auVar46 = vpmullw_avx(auVar8,auVar44);
              auVar44 = vpmulhw_avx(auVar8,auVar44);
              auVar44 = vpunpcklwd_avx(auVar46,auVar44);
              auVar44 = vpaddd_avx(auVar45._0_16_,auVar44);
              auVar45 = ZEXT1664(auVar44);
              lVar26 = lVar26 + 1;
            } while (iVar32 != (int)lVar26);
          }
          *puVar19 = auVar44._0_4_;
          *puVar25 = auVar44._4_4_;
          *puVar41 = auVar44._8_4_;
          *puVar28 = auVar44._12_4_;
          puVar19 = puVar19 + 1;
          puVar25 = puVar25 + 1;
          puVar41 = puVar41 + 1;
          puVar28 = puVar28 + 1;
          uVar12 = (uint)uVar27 + 1;
          uVar27 = (ulong)uVar12;
        } while (uVar12 != uVar3);
      }
      uVar37 = uVar37 + 1;
    } while (uVar37 != local_38);
  }
  uVar37 = (long)iVar4 & 0xfffffffffffffffc;
  if ((int)uVar37 != iVar4) {
    sVar23 = top_blob->elemsize;
    sVar7 = top_blob->cstep;
    pvVar5 = top_blob->data;
    lVar35 = kernel->elemsize * kernel->cstep;
    uVar12 = uVar36 + 3;
    if (-1 < (int)uVar36) {
      uVar12 = uVar36;
    }
    pvVar6 = kernel->data;
    iVar20 = ((int)uVar12 >> 2) * iVar34;
    iVar34 = ((int)uVar36 % 4) * iVar34;
    do {
      piVar18 = (int *)(sVar23 * sVar7 * uVar37 + (long)pvVar5);
      uVar36 = (uint)uVar37;
      if ((int)uVar3 < 2) {
        uVar27 = 0;
      }
      else {
        uVar12 = uVar36 + 3;
        if (-1 < (int)uVar36) {
          uVar12 = uVar36;
        }
        puVar16 = (ulong *)((int)(((int)uVar12 >> 2) + (uVar36 - (uVar12 & 0xfffffffc))) * lVar35 +
                           (long)pvVar6);
        uVar15 = 0;
        do {
          puVar40 = (ulong *)((uVar15 >> 1) * local_88._16_8_ * local_48 + local_88._0_8_);
          puVar42 = puVar16;
          if (iVar20 < 1) {
            iVar29 = 0;
            iVar32 = 0;
          }
          else {
            auVar45 = ZEXT1664((undefined1  [16])0x0);
            auVar47 = ZEXT1664((undefined1  [16])0x0);
            iVar32 = iVar20;
            do {
              auVar48._8_8_ = 0;
              auVar48._0_8_ = *puVar40;
              auVar44 = vpcmpgtb_avx((undefined1  [16])0x0,auVar48);
              auVar46 = vpunpcklbw_avx(auVar48,auVar44);
              auVar10._8_8_ = 0;
              auVar10._0_8_ = *puVar42;
              auVar44 = vpmovsxbw_avx(auVar10);
              auVar44 = vpshufd_avx(auVar44,0x44);
              auVar8 = vpmullw_avx(auVar44,auVar46);
              auVar46 = vpmulhw_avx(auVar46,auVar44);
              auVar44 = vpunpcklwd_avx(auVar8,auVar46);
              auVar44 = vpaddd_avx(auVar47._0_16_,auVar44);
              auVar47 = ZEXT1664(auVar44);
              auVar46 = vpunpckhwd_avx(auVar8,auVar46);
              auVar46 = vpaddd_avx(auVar45._0_16_,auVar46);
              auVar45 = ZEXT1664(auVar46);
              puVar40 = puVar40 + 1;
              puVar42 = (ulong *)((long)puVar42 + 4);
              iVar32 = iVar32 + -1;
            } while (iVar32 != 0);
            auVar44 = vphaddd_avx(auVar44,auVar44);
            auVar44 = vphaddd_avx(auVar44,auVar44);
            iVar29 = auVar44._0_4_;
            auVar44 = vphaddd_avx(auVar46,auVar46);
            auVar44 = vphaddd_avx(auVar44,auVar44);
            iVar32 = auVar44._0_4_;
          }
          if (0 < iVar34) {
            lVar17 = 0;
            do {
              iVar29 = iVar29 + (int)*(char *)((long)puVar40 + lVar17 * 2) *
                                (int)*(char *)((long)puVar42 + lVar17);
              iVar32 = iVar32 + (int)*(char *)((long)puVar40 + lVar17 * 2 + 1) *
                                (int)*(char *)((long)puVar42 + lVar17);
              lVar17 = lVar17 + 1;
            } while (iVar34 != (int)lVar17);
          }
          *piVar18 = iVar29;
          piVar18[1] = iVar32;
          piVar18 = piVar18 + 2;
          uVar27 = uVar15 + 2;
          lVar17 = uVar15 + 3;
          uVar15 = uVar27;
        } while (lVar17 < (long)uVar11);
      }
      if ((int)uVar27 < (int)uVar3) {
        uVar12 = uVar36 + 3;
        if (-1 < (int)uVar36) {
          uVar12 = uVar36;
        }
        pvVar43 = (void *)((int)(((int)uVar12 >> 2) + (uVar36 - (uVar12 & 0xfffffffc))) * lVar35 +
                          (long)pvVar6);
        do {
          pvVar21 = (void *)((ulong)(((uint)uVar27 & 1) + ((uint)(uVar27 >> 1) & 0x7fffffff)) *
                             local_88._16_8_ * local_48 + local_88._0_8_);
          if (iVar20 < 1) {
            iVar32 = 0;
            pvVar31 = pvVar43;
          }
          else {
            auVar45 = ZEXT1664((undefined1  [16])0x0);
            lVar26 = 0;
            lVar17 = 0;
            do {
              auVar1._8_8_ = 0;
              auVar1._0_8_ = *(ulong *)((long)pvVar21 + lVar17 * 4);
              auVar44 = vpmovsxbw_avx(auVar1);
              auVar2._8_8_ = 0;
              auVar2._0_8_ = *(ulong *)((long)pvVar43 + lVar17 * 4);
              auVar46 = vpmovsxbw_avx(auVar2);
              auVar8 = vpmullw_avx(auVar46,auVar44);
              auVar44 = vpmulhw_avx(auVar44,auVar46);
              auVar44 = vpunpcklwd_avx(auVar8,auVar44);
              auVar44 = vpaddd_avx(auVar45._0_16_,auVar44);
              auVar45 = ZEXT1664(auVar44);
              lVar17 = lVar17 + 1;
              lVar26 = lVar26 + -4;
            } while (iVar20 != (int)lVar17);
            auVar44 = vphaddd_avx(auVar44,auVar44);
            auVar44 = vphaddd_avx(auVar44,auVar44);
            iVar32 = auVar44._0_4_;
            pvVar21 = (void *)((long)pvVar21 - lVar26);
            pvVar31 = (void *)((long)pvVar43 - lVar26);
          }
          if (0 < iVar34) {
            lVar17 = 0;
            do {
              iVar32 = iVar32 + (int)*(char *)((long)pvVar31 + lVar17) *
                                (int)*(char *)((long)pvVar21 + lVar17);
              lVar17 = lVar17 + 1;
            } while (iVar34 != (int)lVar17);
          }
          *piVar18 = iVar32;
          piVar18 = piVar18 + 1;
          uVar36 = (uint)uVar27 + 1;
          uVar27 = (ulong)uVar36;
        } while (uVar36 != uVar3);
      }
      uVar37 = uVar37 + 1;
    } while ((long)uVar37 < (long)iVar4);
  }
  piVar18 = (int *)CONCAT44(local_88._12_4_,local_88._8_4_);
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + -1;
    UNLOCK();
    if (*piVar18 == 0) {
      if ((Allocator *)local_88._32_8_ == (Allocator *)0x0) {
        if ((void *)local_88._0_8_ != (void *)0x0) {
          free((void *)local_88._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_88._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

void im2col_sgemm_int8_sse_xop(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    im2col_sgemm_int8_sse(bottom_im2col, top_blob, kernel, opt);
}